

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebug.cxx
# Opt level: O0

int testDebug(int argc,char **param_2)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  double dVar5;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator<char> local_79;
  string local_78 [8];
  string str;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  char **ppcStack_18;
  int retval;
  char **param_1_local;
  int argc_local;
  
  ppcStack_18 = param_2;
  param_1_local._0_4_ = argc;
  if (argc == 1) {
    local_1c = 0;
    bVar1 = cm::anon_unknown_0::dbg_impl<bool>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                       ,0x16,"true",true);
    if (!bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to return true for CM_DBG(true)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1c = 1;
    }
    iVar3 = cm::anon_unknown_0::dbg_impl<int>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                       ,0x17,"4",4);
    if (iVar3 != 4) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to return 4 for CM_DBG(4)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1c = 1;
    }
    dVar5 = cm::anon_unknown_0::dbg_impl<double>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                       ,0x18,"1.",1.0);
    if ((dVar5 != 1.0) || (NAN(dVar5))) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to return 1. for CM_DBG(1.)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1c = 1;
    }
    cVar2 = cm::anon_unknown_0::dbg_impl<char>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                       ,0x19,"\'c\'",'c');
    if (cVar2 != 'c') {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to return \'c\' for CM_DBG(\'c\')");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1c = 1;
    }
    __lhs = cm::(anonymous_namespace)::dbg_impl<char_const*>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                       ,0x1a,"\"literal string\"","literal string");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"literal string",&local_41);
    bVar1 = std::operator!=(__lhs,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Failed to return std::string(\"literal string\") for CM_DBG(\"literal string\")"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1c = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"std string",&local_79);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::string(local_c0,local_78);
    cm::(anonymous_namespace)::dbg_impl<std::__cxx11::string>
              (&local_a0,
               (_anonymous_namespace_ *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
               ,(char *)0x1d,0x12638fd,(char *)local_c0,in_R9);
    bVar1 = std::operator!=(&local_a0,"std string");
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string(local_c0);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Failed to return \"std string\" for CM_DBG(str)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1c = 1;
    }
    bVar1 = (bool)std::__cxx11::string::empty();
    bVar1 = cm::anon_unknown_0::dbg_impl<bool>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                       ,0x1e,"str.empty()",bVar1);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "Failed to return false for CM_DBG(str.empty())");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1c = 1;
    }
    param_1_local._4_4_ = local_1c;
    std::__cxx11::string::~string(local_78);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    param_1_local._4_4_ = -1;
  }
  return param_1_local._4_4_;
}

Assistant:

int testDebug(int argc, char** const /*argv*/)
{
  if (argc != 1) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  check(CM_DBG(true), true);
  check(CM_DBG(4), 4);
  check(CM_DBG(1.), 1.);
  check(CM_DBG('c'), 'c');
  check(CM_DBG("literal string"), std::string("literal string"));

  std::string str = "std string";
  check(CM_DBG(str), "std string");
  check(CM_DBG(str.empty()), false);

  return retval;
}